

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Persistence_landscape_on_grid.h
# Opt level: O2

size_t __thiscall
Gudhi::Persistence_representations::Persistence_landscape_on_grid::number_of_nonzero_levels
          (Persistence_landscape_on_grid *this)

{
  pointer pvVar1;
  long lVar2;
  ulong uVar3;
  ulong uVar4;
  pointer *ppdVar5;
  bool bVar6;
  
  pvVar1 = (this->values_of_landscapes).
           super__Vector_base<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
           ._M_impl.super__Vector_impl_data._M_start;
  lVar2 = ((long)(this->values_of_landscapes).
                 super__Vector_base<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
                 ._M_impl.super__Vector_impl_data._M_finish - (long)pvVar1) / 0x18;
  ppdVar5 = (pointer *)
            ((long)&(pvVar1->super__Vector_base<double,_std::allocator<double>_>)._M_impl.
                    super__Vector_impl_data + 8);
  uVar3 = 0;
  while (bVar6 = lVar2 != 0, lVar2 = lVar2 + -1, bVar6) {
    uVar4 = (long)*ppdVar5 - (long)((_Vector_impl_data *)(ppdVar5 + -1))->_M_start >> 3;
    if (uVar3 < uVar4) {
      uVar3 = uVar4;
    }
    ppdVar5 = ppdVar5 + 3;
  }
  return uVar3;
}

Assistant:

size_t number_of_nonzero_levels() const {
    size_t result = 0;
    for (size_t i = 0; i != this->values_of_landscapes.size(); ++i) {
      if (this->values_of_landscapes[i].size() > result) result = this->values_of_landscapes[i].size();
    }
    return result;
  }